

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_hull(Impl *this)

{
  char cVar1;
  uint uVar2;
  uint value1;
  uint uVar3;
  uint uVar4;
  Builder *this_00;
  MDOperand *pMVar5;
  MDNode *this_01;
  ConstantAsMetadata *this_02;
  Constant *value;
  Function *pFVar6;
  Function *entryPoint;
  LoggingCallback p_Var7;
  void *pvVar8;
  char local_4098 [8];
  char buffer_3 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_3;
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Function *func;
  TessellatorOutputPrimitive primitive;
  TessellatorPartitioning partitioning;
  TessellatorDomain domain;
  uint output_control_points;
  uint input_control_points;
  Constant *patch_constant_value;
  ConstantAsMetadata *patch_constant;
  MDNode *arguments;
  MDOperand *hs_state_node;
  Builder *builder;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityTessellation);
  pMVar5 = get_shader_property_tag(this->entry_point_meta,HSState);
  if (pMVar5 == (MDOperand *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_01 = LLVMBC::cast<LLVMBC::MDNode>(pMVar5);
    pMVar5 = LLVMBC::MDNode::getOperand(this_01,0);
    this_02 = LLVMBC::cast<LLVMBC::ConstantAsMetadata>(pMVar5);
    value = LLVMBC::ConstantAsMetadata::getValue(this_02);
    pFVar6 = LLVMBC::cast<LLVMBC::Function>(&value->super_Value);
    (this->execution_mode_meta).patch_constant_function = pFVar6;
    uVar2 = get_constant_metadata<unsigned_int>(this_01,1);
    value1 = get_constant_metadata<unsigned_int>(this_01,2);
    uVar3 = get_constant_metadata<unsigned_int>(this_01,3);
    cVar1 = (char)uVar3;
    uVar3 = get_constant_metadata<unsigned_int>(this_01,4);
    uVar4 = get_constant_metadata<unsigned_int>(this_01,5);
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    if (cVar1 == '\x01') {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeIsolines,-1,-1,-1);
    }
    else if (cVar1 == '\x02') {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeTriangles,-1,-1,-1);
    }
    else {
      if (cVar1 != '\x03') {
        p_Var7 = get_thread_log_callback();
        if (p_Var7 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Unknown tessellator domain!\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&cb_1,0x1000,"Unknown tessellator domain!\n");
          pvVar8 = get_thread_log_callback_userdata();
          (*p_Var7)(pvVar8,Error,(char *)&cb_1);
        }
        return false;
      }
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeQuads,-1,-1,-1);
    }
    switch((char)uVar3) {
    case '\x01':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeSpacingEqual,-1,-1,-1);
      break;
    case '\x02':
      p_Var7 = get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Emulating Pow2 spacing as Integer.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&cb_2,0x1000,"Emulating Pow2 spacing as Integer.\n");
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,(char *)&cb_2);
      }
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeSpacingEqual,-1,-1,-1);
      break;
    case '\x03':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeSpacingFractionalOdd,-1,-1,-1);
      break;
    case '\x04':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeSpacingFractionalEven,-1,-1,-1)
      ;
      break;
    default:
      p_Var7 = get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Unknown tessellator partitioning.\n");
        fflush(_stderr);
      }
      else {
        snprintf((char *)&cb_3,0x1000,"Unknown tessellator partitioning.\n");
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,(char *)&cb_3);
      }
      return false;
    }
    switch((char)uVar4) {
    case '\x01':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModePointMode,-1,-1,-1);
      break;
    case '\x02':
      break;
    case '\x03':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeVertexOrderCw,-1,-1,-1);
      break;
    case '\x04':
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeVertexOrderCcw,-1,-1,-1);
      break;
    default:
      p_Var7 = get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Unknown tessellator primitive.\n");
        fflush(_stderr);
      }
      else {
        snprintf(local_4098,0x1000,"Unknown tessellator primitive.\n");
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,local_4098);
      }
      return false;
    }
    spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,value1,-1,-1);
    (this->execution_mode_meta).stage_input_num_vertex = uVar2;
    (this->execution_mode_meta).stage_output_num_vertex = value1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_execution_modes_hull()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);
	auto *hs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::HSState);

	if (hs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*hs_state_node);

		auto *patch_constant = llvm::cast<llvm::ConstantAsMetadata>(arguments->getOperand(0));
		auto *patch_constant_value = patch_constant->getValue();
		execution_mode_meta.patch_constant_function = llvm::cast<llvm::Function>(patch_constant_value);

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		unsigned output_control_points = get_constant_metadata(arguments, 2);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 3));
		auto partitioning = static_cast<DXIL::TessellatorPartitioning>(get_constant_metadata(arguments, 4));
		auto primitive = static_cast<DXIL::TessellatorOutputPrimitive>(get_constant_metadata(arguments, 5));

		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		switch (partitioning)
		{
		case DXIL::TessellatorPartitioning::Integer:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::Pow2:
			LOGE("Emulating Pow2 spacing as Integer.\n");
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::FractionalEven:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalEven);
			break;

		case DXIL::TessellatorPartitioning::FractionalOdd:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalOdd);
			break;

		default:
			LOGE("Unknown tessellator partitioning.\n");
			return false;
		}

		switch (primitive)
		{
		case DXIL::TessellatorOutputPrimitive::TriangleCCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCcw);
			break;

		case DXIL::TessellatorOutputPrimitive::TriangleCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCw);
			break;

		case DXIL::TessellatorOutputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModePointMode);
			// TODO: Do we have to specify CCW/CW in point mode?
			break;

		case DXIL::TessellatorOutputPrimitive::Line:
			break;

		default:
			LOGE("Unknown tessellator primitive.\n");
			return false;
		}

		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, output_control_points);

		execution_mode_meta.stage_input_num_vertex = input_control_points;
		execution_mode_meta.stage_output_num_vertex = output_control_points;
		return true;
	}
	else
		return false;
}